

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O2

void __thiscall TypeChar::saveXml(TypeChar *this,ostream *s)

{
  allocator local_31;
  string local_30;
  
  std::operator<<(s,"<type");
  Datatype::saveXmlBasic((Datatype *)this,s);
  std::__cxx11::string::string((string *)&local_30,"char",&local_31);
  a_v_b(s,&local_30,true);
  std::__cxx11::string::~string((string *)&local_30);
  std::operator<<(s,"/>");
  return;
}

Assistant:

void TypeChar::saveXml(ostream &s) const

{
  s << "<type";
  saveXmlBasic(s);
  a_v_b(s,"char",true);
  s << "/>";
}